

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_time.cpp
# Opt level: O3

void mpp_timer_set_enable(MppTimer timer,RK_S32 enable)

{
  MPP_RET MVar1;
  MppThread *this;
  
  if (timer != (MppTimer)0x0) {
    MVar1 = check_is_mpp_timer(timer);
    if (MVar1 == MPP_OK) {
      if (((int)*(uint *)((long)timer + 0x1c) < 0 || *(long *)((long)timer + 0x38) == 0) ||
         (*(int *)((long)timer + 0x20) < 0)) {
        _mpp_log_l(2,"mpp_time","invalid func %p initial %d interval %d\n","mpp_timer_set_enable",
                   *(long *)((long)timer + 0x38),(ulong)*(uint *)((long)timer + 0x1c),
                   *(undefined4 *)((long)timer + 0x20));
      }
      else if (enable == 0) {
        if ((*(int *)((long)timer + 0x18) != 0) &&
           (*(MppThread **)((long)timer + 0x30) != (MppThread *)0x0)) {
          MppThread::stop(*(MppThread **)((long)timer + 0x30));
          *(undefined4 *)((long)timer + 0x18) = 0;
        }
      }
      else if ((*(int *)((long)timer + 0x18) == 0) && (*(long *)((long)timer + 0x30) == 0)) {
        this = (MppThread *)operator_new(0x198);
        MppThread::MppThread(this,mpp_timer_thread,timer,(char *)((long)timer + 8));
        *(MppThread **)((long)timer + 0x30) = this;
        *(undefined4 *)((long)timer + 0x18) = 1;
        MppThread::start(this);
        return;
      }
      return;
    }
  }
  _mpp_log_l(2,"mpp_time","invalid timer %p\n","mpp_timer_set_enable",timer);
  return;
}

Assistant:

void mpp_timer_set_enable(MppTimer timer, RK_S32 enable)
{
    if (NULL == timer || check_is_mpp_timer(timer)) {
        mpp_err_f("invalid timer %p\n", timer);
        return ;
    }

    MppTimerImpl *impl = (MppTimerImpl *)timer;

    if (NULL == impl->func || impl->initial < 0 || impl->interval < 0) {
        mpp_err_f("invalid func %p initial %d interval %d\n",
                  impl->func, impl->initial, impl->interval);
        return ;
    }

    if (enable) {
        if (!impl->enabled && NULL == impl->thd) {
            MppThread *thd = new MppThread(mpp_timer_thread, impl, impl->name);
            if (thd) {
                impl->thd = thd;
                impl->enabled = 1;
                thd->start();
            }
        }
    } else {
        if (impl->enabled && impl->thd) {
            impl->thd->stop();
            impl->enabled = 0;
        }
    }
}